

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O1

int __thiscall
beagle::cpu::BeagleCPUImpl<float,_1,_0>::calcEdgeLogLikelihoodsFirstDeriv
          (BeagleCPUImpl<float,_1,_0> *this,int parIndex,int childIndex,int probIndex,
          int firstDerivativeIndex,int categoryWeightsIndex,int stateFrequenciesIndex,
          int scalingFactorsIndex,double *outSumLogLikelihood,double *outSumFirstDerivative)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  uint uVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  float *pfVar7;
  float *pfVar8;
  float *pfVar9;
  float *pfVar10;
  float *pfVar11;
  int *piVar12;
  float *pfVar13;
  float *pfVar14;
  double *pdVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  long lVar19;
  float *pfVar20;
  long lVar21;
  ulong uVar22;
  int iVar23;
  float *pfVar24;
  long lVar25;
  int iVar26;
  ulong uVar27;
  double dVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  float fVar33;
  double dVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [64];
  undefined1 auVar40 [16];
  undefined8 in_XMM5_Qb;
  
  pfVar7 = this->gPartials[parIndex];
  pfVar8 = this->gTransitionMatrices[probIndex];
  pfVar9 = this->gTransitionMatrices[firstDerivativeIndex];
  pfVar10 = this->gCategoryWeights[categoryWeightsIndex];
  pfVar11 = this->gStateFrequencies[stateFrequenciesIndex];
  memset(this->integrationTmp,0,(long)this->kStateCount * (long)this->kPatternCount * 4);
  memset(this->firstDerivTmp,0,(long)this->kStateCount * (long)this->kPatternCount * 4);
  if ((childIndex < this->kTipCount) &&
     (piVar12 = this->gTipStates[childIndex], piVar12 != (int *)0x0)) {
    iVar26 = this->kCategoryCount;
    if (0 < (long)iVar26) {
      uVar3 = this->kPatternCount;
      uVar4 = this->kStateCount;
      iVar5 = this->kMatrixSize;
      iVar6 = this->kPartialsPaddedStateCount;
      lVar19 = 0;
      iVar17 = 0;
      lVar21 = 0;
      do {
        if (0 < (int)uVar3) {
          fVar33 = pfVar10[lVar19];
          pfVar20 = this->integrationTmp;
          pfVar13 = this->firstDerivTmp;
          iVar18 = this->kTransPaddedStateCount;
          lVar21 = (long)(int)lVar21;
          pfVar24 = pfVar7 + lVar21;
          uVar22 = 0;
          iVar16 = 0;
          do {
            if (0 < (int)uVar4) {
              lVar25 = (long)piVar12[uVar22] + (long)iVar17;
              uVar27 = 0;
              do {
                auVar29 = ZEXT416((uint)fVar33);
                auVar30 = vfmadd213ss_fma(ZEXT416((uint)(pfVar8[lVar25] * pfVar24[uVar27])),auVar29,
                                          ZEXT416((uint)pfVar20[(long)iVar16 + uVar27]));
                pfVar20[(long)iVar16 + uVar27] = auVar30._0_4_;
                auVar30 = vfmadd213ss_fma(ZEXT416((uint)(pfVar9[lVar25] * pfVar24[uVar27])),auVar29,
                                          ZEXT416((uint)pfVar13[(long)iVar16 + uVar27]));
                pfVar13[(long)iVar16 + uVar27] = auVar30._0_4_;
                uVar27 = uVar27 + 1;
                lVar25 = lVar25 + iVar18;
              } while (uVar4 != uVar27);
              iVar16 = iVar16 + (int)uVar27;
            }
            lVar21 = lVar21 + iVar6;
            uVar22 = uVar22 + 1;
            pfVar24 = pfVar24 + iVar6;
          } while (uVar22 != uVar3);
        }
        lVar19 = lVar19 + 1;
        iVar17 = iVar17 + iVar5;
      } while (lVar19 != iVar26);
    }
  }
  else {
    iVar26 = this->kCategoryCount;
    if (0 < (long)iVar26) {
      pfVar24 = this->gPartials[childIndex];
      iVar5 = this->kPatternCount;
      uVar3 = this->kStateCount;
      iVar6 = this->kMatrixSize;
      iVar17 = this->kPartialsPaddedStateCount;
      iVar18 = 0;
      lVar19 = 0;
      lVar21 = 0;
      do {
        if (0 < iVar5) {
          auVar30._0_8_ = (double)pfVar10[lVar19];
          auVar30._8_8_ = in_XMM5_Qb;
          pfVar13 = this->integrationTmp;
          pfVar14 = this->firstDerivTmp;
          lVar21 = (long)(int)lVar21;
          pfVar20 = pfVar24 + lVar21;
          iVar16 = 0;
          lVar25 = 0;
          do {
            if (0 < (int)uVar3) {
              lVar25 = (long)(int)lVar25;
              uVar22 = 0;
              iVar23 = iVar18;
              do {
                dVar34 = 0.0;
                uVar27 = 0;
                dVar28 = 0.0;
                do {
                  dVar28 = dVar28 + (double)(pfVar20[uVar27] * pfVar8[(long)iVar23 + uVar27]);
                  dVar34 = dVar34 + (double)(pfVar20[uVar27] * pfVar9[(long)iVar23 + uVar27]);
                  uVar27 = uVar27 + 1;
                } while (uVar3 != uVar27);
                auVar40._0_8_ = (double)pfVar13[lVar25];
                auVar40._8_8_ = in_XMM5_Qb;
                auVar37._8_8_ = 0;
                auVar37._0_8_ = dVar28 * (double)pfVar7[lVar21 + uVar22];
                auVar29 = vfmadd231sd_fma(auVar40,auVar30,auVar37);
                pfVar13[lVar25] = (float)auVar29._0_8_;
                auVar38._0_8_ = (double)pfVar14[lVar25];
                auVar38._8_8_ = in_XMM5_Qb;
                auVar29._8_8_ = 0;
                auVar29._0_8_ = dVar34 * (double)pfVar7[lVar21 + uVar22];
                auVar29 = vfmadd231sd_fma(auVar38,auVar30,auVar29);
                pfVar14[lVar25] = (float)auVar29._0_8_;
                lVar25 = lVar25 + 1;
                uVar22 = uVar22 + 1;
                iVar23 = iVar23 + uVar3 + 1;
              } while (uVar22 != uVar3);
            }
            lVar21 = lVar21 + iVar17;
            iVar16 = iVar16 + 1;
            pfVar20 = pfVar20 + iVar17;
          } while (iVar16 != iVar5);
        }
        lVar19 = lVar19 + 1;
        iVar18 = iVar18 + iVar6;
      } while (lVar19 != iVar26);
    }
  }
  uVar22 = (ulong)(uint)this->kPatternCount;
  if (0 < this->kPatternCount) {
    lVar19 = 0;
    iVar26 = 0;
    do {
      iVar5 = this->kStateCount;
      if ((long)iVar5 < 1) {
        auVar39 = ZEXT864(0);
        fVar33 = 0.0;
      }
      else {
        auVar30 = ZEXT816(0) << 0x40;
        lVar21 = 0;
        auVar39 = ZEXT864(0);
        do {
          auVar29 = vfmadd231ss_fma(auVar39._0_16_,ZEXT416((uint)pfVar11[lVar21]),
                                    ZEXT416((uint)this->integrationTmp[iVar26 + lVar21]));
          auVar39 = ZEXT1664(auVar29);
          auVar30 = vfmadd231ss_fma(auVar30,ZEXT416((uint)pfVar11[lVar21]),
                                    ZEXT416((uint)this->firstDerivTmp[iVar26 + lVar21]));
          lVar21 = lVar21 + 1;
        } while (iVar5 != lVar21);
        iVar26 = iVar26 + iVar5;
        fVar33 = auVar30._0_4_;
      }
      dVar28 = log((double)auVar39._0_4_);
      this->outLogLikelihoodsTmp[lVar19] = (float)dVar28;
      this->outFirstDerivativesTmp[lVar19] = fVar33 / auVar39._0_4_;
      lVar19 = lVar19 + 1;
      uVar22 = (ulong)this->kPatternCount;
    } while (lVar19 < (long)uVar22);
  }
  if ((scalingFactorsIndex != -1) && (0 < (int)uVar22)) {
    pfVar7 = this->gScaleBuffers[scalingFactorsIndex];
    pfVar8 = this->outLogLikelihoodsTmp;
    uVar27 = 0;
    do {
      pfVar8[uVar27] = pfVar7[uVar27] + pfVar8[uVar27];
      uVar27 = uVar27 + 1;
    } while ((uVar22 & 0xffffffff) != uVar27);
  }
  *outSumLogLikelihood = 0.0;
  *outSumFirstDerivative = 0.0;
  if (0 < (int)uVar22) {
    pdVar15 = this->gPatternWeights;
    pfVar7 = this->outLogLikelihoodsTmp;
    pfVar8 = this->outFirstDerivativesTmp;
    uVar27 = 0;
    do {
      auVar31._0_8_ = (double)pfVar7[uVar27];
      auVar31._8_8_ = in_XMM5_Qb;
      auVar35._8_8_ = 0;
      auVar35._0_8_ = pdVar15[uVar27];
      auVar1._8_8_ = 0;
      auVar1._0_8_ = *outSumLogLikelihood;
      auVar30 = vfmadd213sd_fma(auVar35,auVar31,auVar1);
      *outSumLogLikelihood = auVar30._0_8_;
      auVar32._0_8_ = (double)pfVar8[uVar27];
      auVar32._8_8_ = in_XMM5_Qb;
      auVar36._8_8_ = 0;
      auVar36._0_8_ = pdVar15[uVar27];
      auVar2._8_8_ = 0;
      auVar2._0_8_ = *outSumFirstDerivative;
      auVar30 = vfmadd213sd_fma(auVar36,auVar32,auVar2);
      *outSumFirstDerivative = auVar30._0_8_;
      uVar27 = uVar27 + 1;
    } while ((uVar22 & 0xffffffff) != uVar27);
  }
  return (uint)(!NAN(*outSumLogLikelihood) && !NAN(*outSumLogLikelihood)) * 8 + -8;
}

Assistant:

BEAGLE_CPU_TEMPLATE
int BeagleCPUImpl<BEAGLE_CPU_GENERIC>::calcEdgeLogLikelihoodsFirstDeriv(const int parIndex,
                                                               const int childIndex,
                                                               const int probIndex,
                                                               const int firstDerivativeIndex,
                                                               const int categoryWeightsIndex,
                                                               const int stateFrequenciesIndex,
                                                               const int scalingFactorsIndex,
                                                               double* outSumLogLikelihood,
                                                               double* outSumFirstDerivative) {

    assert(parIndex >= kTipCount);

    int returnCode = BEAGLE_SUCCESS;

    const REALTYPE* partialsParent = gPartials[parIndex];
    const REALTYPE* transMatrix = gTransitionMatrices[probIndex];
    const REALTYPE* firstDerivMatrix = gTransitionMatrices[firstDerivativeIndex];
    const REALTYPE* wt = gCategoryWeights[categoryWeightsIndex];
    const REALTYPE* freqs = gStateFrequencies[stateFrequenciesIndex];


    memset(integrationTmp, 0, (kPatternCount * kStateCount)*sizeof(REALTYPE));
    memset(firstDerivTmp, 0, (kPatternCount * kStateCount)*sizeof(REALTYPE));

    if (childIndex < kTipCount && gTipStates[childIndex]) { // Integrate against a state at the child

        const int* statesChild = gTipStates[childIndex];
        int v = 0; // Index for parent partials

        for(int l = 0; l < kCategoryCount; l++) {
            int u = 0; // Index in resulting product-partials (summed over categories)
            const REALTYPE weight = wt[l];
            for(int k = 0; k < kPatternCount; k++) {

                const int stateChild = statesChild[k];  // DISCUSSION PT: Does it make sense to change the order of the partials,
                // so we can interchange the patterCount and categoryCount loop order?
                int w =  l * kMatrixSize;
                for(int i = 0; i < kStateCount; i++) {
                    integrationTmp[u] += transMatrix[w + stateChild] * partialsParent[v + i] * weight;
                    firstDerivTmp[u] += firstDerivMatrix[w + stateChild] * partialsParent[v + i] * weight;
                    u++;

                    w += kTransPaddedStateCount;
                }
                v += kPartialsPaddedStateCount;
            }
        }

    } else { // Integrate against a partial at the child

        const REALTYPE* partialsChild = gPartials[childIndex];
        int v = 0;

        for(int l = 0; l < kCategoryCount; l++) {
            int u = 0;
            const REALTYPE weight = wt[l];
            for(int k = 0; k < kPatternCount; k++) {
                int w = l * kMatrixSize;
                for(int i = 0; i < kStateCount; i++) {
                    double sumOverJ = 0.0;
                    double sumOverJD1 = 0.0;
                    for(int j = 0; j < kStateCount; j++) {
                        sumOverJ += transMatrix[w] * partialsChild[v + j];
                        sumOverJD1 += firstDerivMatrix[w] * partialsChild[v + j];
                        w++;
                    }

                    // increment for the extra column at the end
                    w += T_PAD;

                    integrationTmp[u] += sumOverJ * partialsParent[v + i] * weight;
                    firstDerivTmp[u] += sumOverJD1 * partialsParent[v + i] * weight;
                    u++;
                }
                v += kPartialsPaddedStateCount;
            }
        }
    }

    int u = 0;
    for(int k = 0; k < kPatternCount; k++) {
        REALTYPE sumOverI = 0.0;
        REALTYPE sumOverID1 = 0.0;
        for(int i = 0; i < kStateCount; i++) {
            sumOverI += freqs[i] * integrationTmp[u];
            sumOverID1 += freqs[i] * firstDerivTmp[u];
            u++;
        }

        outLogLikelihoodsTmp[k] = log(sumOverI);
        outFirstDerivativesTmp[k] = sumOverID1 / sumOverI;
    }


    if (scalingFactorsIndex != BEAGLE_OP_NONE) {
        const REALTYPE* scalingFactors = gScaleBuffers[scalingFactorsIndex];
        for(int k=0; k < kPatternCount; k++)
            outLogLikelihoodsTmp[k] += scalingFactors[k];
    }

    *outSumLogLikelihood = 0.0;
    *outSumFirstDerivative = 0.0;
    for (int i = 0; i < kPatternCount; i++) {
        *outSumLogLikelihood += outLogLikelihoodsTmp[i] * gPatternWeights[i];

        *outSumFirstDerivative += outFirstDerivativesTmp[i] * gPatternWeights[i];
    }

    if (*outSumLogLikelihood != *outSumLogLikelihood)
        returnCode = BEAGLE_ERROR_FLOATING_POINT;

    return returnCode;
}